

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O1

lzma_ret stream_decode(lzma_coder_conflict1 *coder,lzma_allocator *allocator,uint8_t *in,
                      size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                      lzma_action action)

{
  lzma_block *block;
  uint8_t *out_00;
  size_t *out_pos_00;
  lzma_check type;
  ulong uVar1;
  lzma_bool lVar2;
  lzma_ret lVar3;
  lzma_ret lVar4;
  lzma_vli lVar5;
  ulong uVar6;
  lzma_index_hash *plVar7;
  uint64_t uVar8;
  anon_enum_32 aVar9;
  uint8_t *puVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  bool bVar14;
  lzma_ret local_d4;
  lzma_stream_flags footer_flags;
  
  out_00 = coder->buffer;
  out_pos_00 = &coder->pos;
  block = &coder->block_options;
  puVar10 = in;
LAB_0019a217:
  local_d4 = (lzma_ret)puVar10;
  lVar3 = local_d4;
  switch(coder->sequence) {
  case SEQ_INDICATOR:
    lzma_bufcpy(in,in_pos,in_size,out_00,out_pos_00,0xc);
    bVar12 = 0;
    lVar3 = LZMA_OK;
    if (0xb < *out_pos_00) {
      *out_pos_00 = 0;
      lVar3 = lzma_stream_header_decode(&coder->stream_flags,out_00);
      if (lVar3 == LZMA_OK) {
        coder->first_stream = false;
        type = (coder->stream_flags).check;
        (coder->block_options).check = type;
        coder->sequence = SEQ_BLOCK_HEADER;
        if ((coder->tell_no_check & type == LZMA_CHECK_NONE) == 0) {
          if ((coder->tell_unsupported_check != true) ||
             (lVar2 = lzma_check_is_supported(type), lVar2 != '\0')) {
            lVar3 = local_d4;
            if (coder->tell_any_check != false) {
              lVar3 = LZMA_GET_CHECK;
            }
            bVar12 = coder->tell_any_check ^ 1;
            goto LAB_0019a483;
          }
          lVar3 = LZMA_UNSUPPORTED_CHECK;
        }
        else {
          lVar3 = LZMA_NO_CHECK;
        }
      }
      else if ((lVar3 == LZMA_FORMAT_ERROR) && (coder->first_stream != true)) {
        lVar3 = LZMA_DATA_ERROR;
      }
      bVar12 = 0;
    }
LAB_0019a483:
    if (bVar12 == 0) {
      return lVar3;
    }
    break;
  case SEQ_BLOCK_HEADER:
    break;
  case SEQ_BLOCK:
    goto LAB_0019a655;
  case SEQ_CODER_INIT:
    bVar14 = false;
    lVar3 = LZMA_OK;
    if (*in_pos < in_size) {
      lVar3 = lzma_index_hash_decode(coder->index_hash,in,in_pos,in_size);
      if (lVar3 == LZMA_STREAM_END) {
        coder->sequence = SEQ_CODE;
        bVar14 = true;
        lVar3 = local_d4;
      }
      else {
        bVar14 = false;
      }
    }
    if (!bVar14) {
      return lVar3;
    }
  case SEQ_CODE:
    lzma_bufcpy(in,in_pos,in_size,out_00,out_pos_00,0xc);
    bVar14 = false;
    local_d4 = LZMA_OK;
    if (*out_pos_00 < 0xc) goto LAB_0019a397;
    *out_pos_00 = 0;
    local_d4 = lzma_stream_footer_decode(&footer_flags,out_00);
    if (local_d4 == LZMA_OK) {
      lVar5 = lzma_index_hash_size(coder->index_hash);
      if (lVar5 != footer_flags.backward_size) {
        local_d4 = LZMA_DATA_ERROR;
        goto LAB_0019a395;
      }
      local_d4 = lzma_stream_flags_compare(&coder->stream_flags,&footer_flags);
      if (local_d4 == LZMA_OK) {
        if (coder->concatenated != true) {
          local_d4 = LZMA_STREAM_END;
          goto LAB_0019a395;
        }
        coder->sequence = SEQ_LITERAL3;
        bVar14 = true;
        local_d4 = lVar3;
      }
      else {
        bVar14 = false;
      }
    }
    else {
      if (local_d4 == LZMA_FORMAT_ERROR) {
        local_d4 = LZMA_DATA_ERROR;
      }
LAB_0019a395:
      bVar14 = false;
    }
LAB_0019a397:
    if (!bVar14) {
      return local_d4;
    }
switchD_0019a231_caseD_5:
    if (coder->concatenated != true) {
      __assert_fail("coder->concatenated",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/stream_decoder.c"
                    ,0x14a,
                    "lzma_ret stream_decode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
    uVar1 = *in_pos;
    if (in_size <= uVar1) {
LAB_0019a6f8:
      if (action != LZMA_FINISH) {
        return LZMA_OK;
      }
      return (uint)(coder->pos != 0) * 8 + LZMA_STREAM_END;
    }
    while (uVar6 = uVar1 + 1, in[uVar1] == '\0') {
      *in_pos = uVar6;
      coder->pos = (ulong)((int)coder->pos + 1U & 3);
      uVar1 = uVar6;
      if (uVar6 == in_size) goto LAB_0019a6f8;
    }
    if (coder->pos != 0) {
      *in_pos = uVar6;
      return LZMA_DATA_ERROR;
    }
    plVar7 = lzma_index_hash_init(coder->index_hash,allocator);
    coder->index_hash = plVar7;
    if (plVar7 == (lzma_index_hash *)0x0) {
      puVar10 = (uint8_t *)0x5;
    }
    else {
      coder->sequence = SEQ_INDICATOR;
      coder->pos = 0;
      puVar10 = (uint8_t *)(ulong)local_d4;
    }
    if (plVar7 == (lzma_index_hash *)0x0) {
      return (lzma_ret)puVar10;
    }
    goto LAB_0019a217;
  case SEQ_LITERAL3:
    goto switchD_0019a231_caseD_5;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/stream_decoder.c"
                  ,0x170,
                  "lzma_ret stream_decode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  puVar10 = (uint8_t *)0x0;
  iVar13 = 1;
  if (*in_pos < in_size) {
    if (*out_pos_00 == 0) {
      if (in[*in_pos] != 0) {
        (coder->block_options).header_size = (uint)in[*in_pos] * 4 + 4;
        goto LAB_0019a4c4;
      }
      iVar13 = 4;
      aVar9 = SEQ_CODER_INIT;
LAB_0019a631:
      coder->sequence = aVar9;
      puVar10 = (uint8_t *)(ulong)lVar3;
    }
    else {
LAB_0019a4c4:
      lzma_bufcpy(in,in_pos,in_size,out_00,out_pos_00,(ulong)(coder->block_options).header_size);
      if (coder->pos < (ulong)(coder->block_options).header_size) {
        puVar10 = (uint8_t *)0x0;
      }
      else {
        coder->pos = 0;
        (coder->block_options).version = 0;
        (coder->block_options).filters = (lzma_filter *)&footer_flags;
        lVar4 = lzma_block_header_decode(block,allocator,out_00);
        if (lVar4 != LZMA_OK) {
          lVar3 = lVar4;
        }
        puVar10 = (uint8_t *)(ulong)lVar3;
        if (lVar4 == LZMA_OK) {
          uVar8 = lzma_raw_decoder_memusage((lzma_filter *)&footer_flags);
          if (uVar8 == 0xffffffffffffffff) {
            lVar4 = LZMA_OPTIONS_ERROR;
          }
          else {
            coder->memusage = uVar8;
            lVar4 = LZMA_MEMLIMIT_ERROR;
            if (uVar8 <= coder->memlimit) {
              lVar4 = lzma_block_decoder_init
                                ((lzma_next_coder_conflict10 *)&coder->block_decoder,allocator,block
                                );
            }
          }
          lVar11 = 0;
          do {
            lzma_free(*(void **)((long)&footer_flags.backward_size + lVar11),allocator);
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x40);
          (coder->block_options).filters = (lzma_filter *)0x0;
          puVar10 = (uint8_t *)(ulong)lVar4;
          iVar13 = 1;
          if (lVar4 != LZMA_OK) goto LAB_0019a635;
          iVar13 = 0;
          aVar9 = SEQ_BLOCK;
          goto LAB_0019a631;
        }
      }
      iVar13 = 1;
    }
  }
LAB_0019a635:
  local_d4 = (lzma_ret)puVar10;
  if (iVar13 == 0) {
LAB_0019a655:
    lVar3 = (*(coder->block_decoder).code)
                      ((coder->block_decoder).coder,allocator,in,in_pos,in_size,out,out_pos,out_size
                       ,action);
    bVar14 = true;
    if (lVar3 == LZMA_STREAM_END) {
      plVar7 = coder->index_hash;
      lVar5 = lzma_block_unpadded_size(block);
      lVar3 = lzma_index_hash_append(plVar7,lVar5,(coder->block_options).uncompressed_size);
      bVar14 = lVar3 != LZMA_OK;
      if (!bVar14) {
        coder->sequence = SEQ_BLOCK_HEADER;
        lVar3 = local_d4;
      }
    }
    puVar10 = (uint8_t *)(ulong)lVar3;
    if (bVar14) {
      return lVar3;
    }
  }
  else if (iVar13 != 4) {
    return local_d4;
  }
  goto LAB_0019a217;
}

Assistant:

static lzma_ret
stream_decode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	// When decoding the actual Block, it may be able to produce more
	// output even if we don't give it any new input.
	while (true)
	switch (coder->sequence) {
	case SEQ_STREAM_HEADER: {
		lzma_ret ret;

		// Copy the Stream Header to the internal buffer.
		lzma_bufcpy(in, in_pos, in_size, coder->buffer, &coder->pos,
				LZMA_STREAM_HEADER_SIZE);

		// Return if we didn't get the whole Stream Header yet.
		if (coder->pos < LZMA_STREAM_HEADER_SIZE)
			return LZMA_OK;

		coder->pos = 0;

		// Decode the Stream Header.
		ret = lzma_stream_header_decode(
				&coder->stream_flags, coder->buffer);
		if (ret != LZMA_OK)
			return ret == LZMA_FORMAT_ERROR && !coder->first_stream
					? LZMA_DATA_ERROR : ret;

		// If we are decoding concatenated Streams, and the later
		// Streams have invalid Header Magic Bytes, we give
		// LZMA_DATA_ERROR instead of LZMA_FORMAT_ERROR.
		coder->first_stream = false;

		// Copy the type of the Check so that Block Header and Block
		// decoders see it.
		coder->block_options.check = coder->stream_flags.check;

		// Even if we return LZMA_*_CHECK below, we want
		// to continue from Block Header decoding.
		coder->sequence = SEQ_BLOCK_HEADER;

		// Detect if there's no integrity check or if it is
		// unsupported if those were requested by the application.
		if (coder->tell_no_check && coder->stream_flags.check
				== LZMA_CHECK_NONE)
			return LZMA_NO_CHECK;

		if (coder->tell_unsupported_check
				&& !lzma_check_is_supported(
					coder->stream_flags.check))
			return LZMA_UNSUPPORTED_CHECK;

		if (coder->tell_any_check)
			return LZMA_GET_CHECK;
	}

	// Fall through

	case SEQ_BLOCK_HEADER: {
		lzma_filter filters[LZMA_FILTERS_MAX + 1];
		uint64_t memusage;
		lzma_ret ret;
		size_t i;

		if (*in_pos >= in_size)
			return LZMA_OK;

		if (coder->pos == 0) {
			// Detect if it's Index.
			if (in[*in_pos] == 0x00) {
				coder->sequence = SEQ_INDEX;
				break;
			}

			// Calculate the size of the Block Header. Note that
			// Block Header decoder wants to see this byte too
			// so don't advance *in_pos.
			coder->block_options.header_size
					= lzma_block_header_size_decode(
						in[*in_pos]);
		}

		// Copy the Block Header to the internal buffer.
		lzma_bufcpy(in, in_pos, in_size, coder->buffer, &coder->pos,
				coder->block_options.header_size);

		// Return if we didn't get the whole Block Header yet.
		if (coder->pos < coder->block_options.header_size)
			return LZMA_OK;

		coder->pos = 0;

		// Version 0 is currently the only possible version.
		coder->block_options.version = 0;

		// Set up a buffer to hold the filter chain. Block Header
		// decoder will initialize all members of this array so
		// we don't need to do it here.
		coder->block_options.filters = filters;

		// Decode the Block Header.
		return_if_error(lzma_block_header_decode(&coder->block_options,
				allocator, coder->buffer));

		// Check the memory usage limit.
		memusage = lzma_raw_decoder_memusage(filters);
		if (memusage == UINT64_MAX) {
			// One or more unknown Filter IDs.
			ret = LZMA_OPTIONS_ERROR;
		} else {
			// Now we can set coder->memusage since we know that
			// the filter chain is valid. We don't want
			// lzma_memusage() to return UINT64_MAX in case of
			// invalid filter chain.
			coder->memusage = memusage;

			if (memusage > coder->memlimit) {
				// The chain would need too much memory.
				ret = LZMA_MEMLIMIT_ERROR;
			} else {
				// Memory usage is OK.
				// Initialize the Block decoder.
				ret = lzma_block_decoder_init(
						&coder->block_decoder,
						allocator,
						&coder->block_options);
			}
		}

		// Free the allocated filter options since they are needed
		// only to initialize the Block decoder.
		for (i = 0; i < LZMA_FILTERS_MAX; ++i)
			lzma_free(filters[i].options, allocator);

		coder->block_options.filters = NULL;

		// Check if memory usage calculation and Block enocoder
		// initialization succeeded.
		if (ret != LZMA_OK)
			return ret;

		coder->sequence = SEQ_BLOCK;
	}

	// Fall through

	case SEQ_BLOCK: {
		const lzma_ret ret = coder->block_decoder.code(
				coder->block_decoder.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		if (ret != LZMA_STREAM_END)
			return ret;

		// Block decoded successfully. Add the new size pair to
		// the Index hash.
		return_if_error(lzma_index_hash_append(coder->index_hash,
				lzma_block_unpadded_size(
					&coder->block_options),
				coder->block_options.uncompressed_size));

		coder->sequence = SEQ_BLOCK_HEADER;
		break;
	}

	case SEQ_INDEX: {
		lzma_ret ret;

		// If we don't have any input, don't call
		// lzma_index_hash_decode() since it would return
		// LZMA_BUF_ERROR, which we must not do here.
		if (*in_pos >= in_size)
			return LZMA_OK;

		// Decode the Index and compare it to the hash calculated
		// from the sizes of the Blocks (if any).
		ret = lzma_index_hash_decode(coder->index_hash,
				in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			return ret;

		coder->sequence = SEQ_STREAM_FOOTER;
	}

	// Fall through

	case SEQ_STREAM_FOOTER: {
		lzma_stream_flags footer_flags;
		lzma_ret ret;

		// Copy the Stream Footer to the internal buffer.
		lzma_bufcpy(in, in_pos, in_size, coder->buffer, &coder->pos,
				LZMA_STREAM_HEADER_SIZE);

		// Return if we didn't get the whole Stream Footer yet.
		if (coder->pos < LZMA_STREAM_HEADER_SIZE)
			return LZMA_OK;

		coder->pos = 0;

		// Decode the Stream Footer. The decoder gives
		// LZMA_FORMAT_ERROR if the magic bytes don't match,
		// so convert that return code to LZMA_DATA_ERROR.
		ret = lzma_stream_footer_decode(
				&footer_flags, coder->buffer);
		if (ret != LZMA_OK)
			return ret == LZMA_FORMAT_ERROR
					? LZMA_DATA_ERROR : ret;

		// Check that Index Size stored in the Stream Footer matches
		// the real size of the Index field.
		if (lzma_index_hash_size(coder->index_hash)
				!= footer_flags.backward_size)
			return LZMA_DATA_ERROR;

		// Compare that the Stream Flags fields are identical in
		// both Stream Header and Stream Footer.
		return_if_error(lzma_stream_flags_compare(
				&coder->stream_flags, &footer_flags));

		if (!coder->concatenated)
			return LZMA_STREAM_END;

		coder->sequence = SEQ_STREAM_PADDING;
	}

	// Fall through

	case SEQ_STREAM_PADDING:
		assert(coder->concatenated);

		// Skip over possible Stream Padding.
		while (true) {
			if (*in_pos >= in_size) {
				// Unless LZMA_FINISH was used, we cannot
				// know if there's more input coming later.
				if (action != LZMA_FINISH)
					return LZMA_OK;

				// Stream Padding must be a multiple of
				// four bytes.
				return coder->pos == 0
						? LZMA_STREAM_END
						: LZMA_DATA_ERROR;
			}

			// If the byte is not zero, it probably indicates
			// beginning of a new Stream (or the file is corrupt).
			if (in[*in_pos] != 0x00)
				break;

			++*in_pos;
			coder->pos = (coder->pos + 1) & 3;
		}

		// Stream Padding must be a multiple of four bytes (empty
		// Stream Padding is OK).
		if (coder->pos != 0) {
			++*in_pos;
			return LZMA_DATA_ERROR;
		}

		// Prepare to decode the next Stream.
		return_if_error(stream_decoder_reset(coder, allocator));
		break;

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

	// Never reached
}